

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glyph.cc
# Opt level: O1

bool woff2::ReadGlyph(uint8_t *data,size_t len,Glyph *glyph)

{
  undefined1 *puVar1;
  byte *pbVar2;
  pointer puVar3;
  bool bVar4;
  vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
  *pvVar5;
  ushort uVar6;
  ushort uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ushort uVar11;
  pointer pvVar12;
  undefined1 *puVar13;
  int iVar14;
  ulong uVar15;
  int *piVar16;
  long lVar17;
  uint8_t uVar18;
  byte bVar19;
  long lVar20;
  bool bVar21;
  bool bVar22;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  flags;
  undefined1 *local_a0;
  Buffer local_98;
  vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
  *local_80;
  uint8_t *local_78;
  allocator_type local_69;
  pointer local_68;
  ulong local_60;
  uint local_54;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_50;
  pointer local_38;
  
  if (len < 2) {
    return false;
  }
  uVar11 = *(ushort *)data << 8 | *(ushort *)data >> 8;
  if (len < 4) {
    return false;
  }
  glyph->x_min = *(ushort *)(data + 2) << 8 | *(ushort *)(data + 2) >> 8;
  if (len < 6) {
    return false;
  }
  glyph->y_min = *(ushort *)(data + 4) << 8 | *(ushort *)(data + 4) >> 8;
  if (len < 8) {
    return false;
  }
  glyph->x_max = *(ushort *)(data + 6) << 8 | *(ushort *)(data + 6) >> 8;
  local_98.offset_ = 10;
  if (len < 10) {
    return false;
  }
  glyph->y_max = *(ushort *)(data + 8) << 8 | *(ushort *)(data + 8) >> 8;
  if (uVar11 == 0) {
    return true;
  }
  local_98.buffer_ = data;
  local_98.length_ = len;
  if ((short)uVar11 < 1) {
    if (uVar11 != 0xffff) {
      return false;
    }
    bVar21 = ReadCompositeGlyphData(&local_98,glyph);
    if (!bVar21) {
      return false;
    }
    if (glyph->have_instructions == true) {
      puVar13 = (undefined1 *)
                ((long)&(((_Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_> *
                          )local_98.offset_)->_M_impl).super__Vector_impl_data + 2);
      if (local_98.length_ < puVar13) {
        return false;
      }
      uVar11 = *(ushort *)(local_98.buffer_ + local_98.offset_) << 8 |
               *(ushort *)(local_98.buffer_ + local_98.offset_) >> 8;
      glyph->instructions_size = uVar11;
      glyph->instructions_data = data + (long)puVar13;
      if (local_98.length_ < puVar13 + uVar11) {
        return false;
      }
      if ((undefined1 *)(local_98.length_ + -(ulong)uVar11) < puVar13) {
        return false;
      }
    }
    else {
      glyph->instructions_size = 0;
    }
    return true;
  }
  local_80 = &glyph->contours;
  local_54 = (uint)uVar11;
  local_78 = data;
  std::
  vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
  ::resize(local_80,(ulong)uVar11);
  lVar17 = 0;
  pvVar12 = (pointer)local_98.offset_;
  local_60 = (ulong)uVar11;
  uVar6 = 0;
  do {
    local_68 = (pointer)((long)&(pvVar12->
                                super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                                )._M_impl.super__Vector_impl_data + 2);
    if (len < local_68) {
      return false;
    }
    uVar7 = *(ushort *)(local_78 + (long)pvVar12) << 8 | *(ushort *)(local_78 + (long)pvVar12) >> 8;
    std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>::resize
              ((vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_> *)
               ((long)&(((local_80->
                         super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                       )._M_impl.super__Vector_impl_data + lVar17),
               (ulong)(ushort)(uVar7 - (uVar6 - (lVar17 == 0))));
    lVar17 = lVar17 + 0x18;
    pvVar12 = local_68;
    uVar6 = uVar7;
  } while ((ulong)((uint)uVar11 * 8) * 3 != lVar17);
  puVar13 = (undefined1 *)
            ((long)&(local_68->
                    super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>).
                    _M_impl.super__Vector_impl_data + 2);
  if (len < puVar13) {
    return false;
  }
  uVar11 = *(ushort *)(local_78 + (long)local_68) << 8 | *(ushort *)(local_78 + (long)local_68) >> 8
  ;
  glyph->instructions_size = uVar11;
  glyph->instructions_data = local_78 + (long)puVar13;
  local_a0 = puVar13 + uVar11;
  if (len < local_a0) {
    return false;
  }
  if ((undefined1 *)(len - uVar11) < puVar13) {
    return false;
  }
  local_98.offset_ = (size_t)local_a0;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector(&local_50,local_60,&local_69);
  uVar10 = 0;
  uVar18 = '\0';
  bVar19 = 0;
  do {
    pvVar5 = local_80;
    pvVar12 = (local_80->
              super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (local_50.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar10,
               ((long)*(pointer *)
                       ((long)&pvVar12[uVar10].
                               super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                               ._M_impl.super__Vector_impl_data + 8) -
                *(long *)&pvVar12[uVar10].
                          super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                          ._M_impl.super__Vector_impl_data >> 2) * -0x5555555555555555);
    pvVar12 = (pvVar5->
              super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (*(pointer *)
         ((long)&pvVar12[uVar10].
                 super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>.
                 _M_impl.super__Vector_impl_data + 8) !=
        pvVar12[uVar10].
        super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>._M_impl.
        super__Vector_impl_data._M_start) {
      lVar17 = 8;
      uVar9 = 0;
      puVar13 = local_a0;
      do {
        if (uVar18 == '\0') {
          puVar1 = puVar13 + 1;
          if (len < puVar1) goto LAB_0010815e;
          bVar19 = local_78[(long)puVar13];
          local_a0 = puVar1;
          if ((bVar19 & 8) != 0) {
            local_a0 = puVar13 + 2;
            puVar13 = puVar1;
            if (len < local_a0) goto LAB_0010815e;
            uVar18 = local_78[(long)puVar1];
          }
        }
        else {
          uVar18 = uVar18 + 0xff;
          local_a0 = puVar13;
        }
        local_50.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar10].
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar9] = bVar19;
        pvVar12 = (local_80->
                  super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        *(byte *)(*(long *)&pvVar12[uVar10].
                            super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                            ._M_impl.super__Vector_impl_data + lVar17) = bVar19 & 1;
        uVar9 = uVar9 + 1;
        lVar17 = lVar17 + 0xc;
        puVar13 = local_a0;
      } while (uVar9 < (ulong)(((long)*(pointer *)
                                       ((long)&pvVar12[uVar10].
                                               super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                                               ._M_impl.super__Vector_impl_data + 8) -
                                *(long *)&pvVar12[uVar10].
                                          super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                                          ._M_impl.super__Vector_impl_data >> 2) *
                              -0x5555555555555555));
    }
    uVar10 = uVar10 + 1;
  } while (uVar10 != local_60);
  local_68 = (local_80->
             super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_38 = local_50.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  uVar10 = 0;
  bVar21 = true;
  iVar14 = 0;
  do {
    piVar16 = *(int **)&local_68[uVar10].
                        super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                        ._M_impl.super__Vector_impl_data;
    lVar17 = (long)*(pointer *)
                    ((long)&local_68[uVar10].
                            super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                            ._M_impl.super__Vector_impl_data + 8) - (long)piVar16;
    bVar22 = lVar17 != 0;
    if (bVar22) {
      lVar17 = lVar17 >> 2;
      uVar15 = lVar17 * -0x5555555555555555;
      puVar3 = local_50.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar10].
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = 1;
      do {
        bVar19 = puVar3[uVar9 - 1];
        if ((bVar19 & 2) == 0) {
          if ((bVar19 & 0x10) == 0) {
            if (len < local_a0 + 2) goto LAB_0010806e;
            uVar11 = *(ushort *)(local_78 + (long)local_a0) << 8 |
                     *(ushort *)(local_78 + (long)local_a0) >> 8;
            local_a0 = local_a0 + 2;
          }
          else {
            uVar11 = 0;
          }
          uVar8 = (int)(short)uVar11;
LAB_00108077:
          iVar14 = iVar14 + uVar8;
          *piVar16 = iVar14;
          bVar4 = true;
        }
        else {
          puVar13 = local_a0 + 1;
          if (puVar13 <= len) {
            pbVar2 = local_78 + (long)local_a0;
            uVar8 = -(uint)*pbVar2;
            local_a0 = puVar13;
            if ((bVar19 & 0x10) != 0) {
              uVar8 = (uint)*pbVar2;
            }
            goto LAB_00108077;
          }
LAB_0010806e:
          bVar4 = false;
        }
        if (!bVar4) break;
        bVar22 = uVar9 < uVar15;
        piVar16 = piVar16 + 3;
        lVar20 = uVar9 + (lVar17 * 0x5555555555555555 - (ulong)(uVar15 == 0));
        uVar9 = uVar9 + 1;
      } while (lVar20 != 0);
    }
    if (bVar22) {
      puVar13 = local_a0;
      if (bVar21) {
LAB_0010815e:
        local_98.offset_ = (size_t)puVar13;
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~vector(&local_50);
        return false;
      }
      goto LAB_00108190;
    }
    uVar10 = uVar10 + 1;
    bVar21 = uVar10 < local_60;
    if (uVar10 == local_60) {
LAB_00108190:
      pvVar12 = (local_80->
                super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      local_80 = (vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                  *)local_50.
                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = 1;
      if (1 < (ushort)local_54) {
        uVar8 = local_54;
      }
      local_68 = (pointer)(ulong)(uVar8 & 0xffff);
      uVar10 = 0;
      bVar21 = true;
      iVar14 = 0;
      do {
        lVar17 = *(long *)&pvVar12[uVar10].
                           super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                           ._M_impl.super__Vector_impl_data;
        lVar20 = (long)*(pointer *)
                        ((long)&pvVar12[uVar10].
                                super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                                ._M_impl.super__Vector_impl_data + 8) - lVar17;
        bVar22 = lVar20 != 0;
        if (bVar22) {
          lVar20 = lVar20 >> 2;
          uVar15 = lVar20 * -0x5555555555555555;
          puVar3 = local_50.
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar10].
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar16 = (int *)(lVar17 + 4);
          uVar9 = 1;
          puVar13 = local_a0;
          do {
            bVar19 = puVar3[uVar9 - 1];
            if ((bVar19 & 4) == 0) {
              if ((bVar19 & 0x20) == 0) {
                if (len < puVar13 + 2) goto LAB_0010827a;
                uVar11 = *(ushort *)(local_78 + (long)puVar13) << 8 |
                         *(ushort *)(local_78 + (long)puVar13) >> 8;
                puVar13 = puVar13 + 2;
              }
              else {
                uVar11 = 0;
              }
              local_a0 = puVar13;
              uVar8 = (int)(short)uVar11;
LAB_00108284:
              iVar14 = iVar14 + uVar8;
              *piVar16 = iVar14;
              bVar4 = true;
            }
            else {
              local_a0 = puVar13 + 1;
              if (local_a0 <= len) {
                uVar8 = -(uint)local_78[(long)puVar13];
                if ((bVar19 & 0x20) != 0) {
                  uVar8 = (uint)local_78[(long)puVar13];
                }
                goto LAB_00108284;
              }
LAB_0010827a:
              bVar4 = false;
              local_a0 = puVar13;
            }
            if (!bVar4) break;
            bVar22 = uVar9 < uVar15;
            piVar16 = piVar16 + 3;
            lVar17 = uVar9 + (lVar20 * 0x5555555555555555 - (ulong)(uVar15 == 0));
            uVar9 = uVar9 + 1;
            puVar13 = local_a0;
          } while (lVar17 != 0);
        }
        local_98.offset_ = (size_t)local_a0;
        if (bVar22) {
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::~vector(&local_50);
          if (!bVar21) {
            return true;
          }
          return false;
        }
        uVar10 = uVar10 + 1;
        bVar21 = uVar10 < local_60;
        if ((pointer)uVar10 == local_68) {
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::~vector(&local_50);
          return true;
        }
      } while( true );
    }
  } while( true );
}

Assistant:

bool ReadGlyph(const uint8_t* data, size_t len, Glyph* glyph) {
  Buffer buffer(data, len);

  int16_t num_contours;
  if (!buffer.ReadS16(&num_contours)) {
    return FONT_COMPRESSION_FAILURE();
  }

  // Read the bounding box.
  if (!buffer.ReadS16(&glyph->x_min) ||
      !buffer.ReadS16(&glyph->y_min) ||
      !buffer.ReadS16(&glyph->x_max) ||
      !buffer.ReadS16(&glyph->y_max)) {
    return FONT_COMPRESSION_FAILURE();
  }

  if (num_contours == 0) {
    // Empty glyph.
    return true;
  }

  if (num_contours > 0) {
    // Simple glyph.
    glyph->contours.resize(num_contours);

    // Read the number of points per contour.
    uint16_t last_point_index = 0;
    for (int i = 0; i < num_contours; ++i) {
      uint16_t point_index;
      if (!buffer.ReadU16(&point_index)) {
        return FONT_COMPRESSION_FAILURE();
      }
      uint16_t num_points = point_index - last_point_index + (i == 0 ? 1 : 0);
      glyph->contours[i].resize(num_points);
      last_point_index = point_index;
    }

    // Read the instructions.
    if (!buffer.ReadU16(&glyph->instructions_size)) {
      return FONT_COMPRESSION_FAILURE();
    }
    glyph->instructions_data = data + buffer.offset();
    if (!buffer.Skip(glyph->instructions_size)) {
      return FONT_COMPRESSION_FAILURE();
    }

    // Read the run-length coded flags.
    std::vector<std::vector<uint8_t> > flags(num_contours);
    {
      uint8_t flag = 0;
      uint8_t flag_repeat = 0;
      for (int i = 0; i < num_contours; ++i) {
        flags[i].resize(glyph->contours[i].size());
        for (size_t j = 0; j < glyph->contours[i].size(); ++j) {
          if (flag_repeat == 0) {
            if (!buffer.ReadU8(&flag)) {
              return FONT_COMPRESSION_FAILURE();
            }
            if (flag & kFLAG_REPEAT) {
              if (!buffer.ReadU8(&flag_repeat)) {
                return FONT_COMPRESSION_FAILURE();
              }
            }
          } else {
            flag_repeat--;
          }
          flags[i][j] = flag;
          glyph->contours[i][j].on_curve = flag & kFLAG_ONCURVE;
        }
      }
    }

    // Read the x coordinates.
    int prev_x = 0;
    for (int i = 0; i < num_contours; ++i) {
      for (size_t j = 0; j < glyph->contours[i].size(); ++j) {
        uint8_t flag = flags[i][j];
        if (flag & kFLAG_XSHORT) {
          // single byte x-delta coord value
          uint8_t x_delta;
          if (!buffer.ReadU8(&x_delta)) {
            return FONT_COMPRESSION_FAILURE();
          }
          int sign = (flag & kFLAG_XREPEATSIGN) ? 1 : -1;
          glyph->contours[i][j].x = prev_x + sign * x_delta;
        } else {
          // double byte x-delta coord value
          int16_t x_delta = 0;
          if (!(flag & kFLAG_XREPEATSIGN)) {
            if (!buffer.ReadS16(&x_delta)) {
              return FONT_COMPRESSION_FAILURE();
            }
          }
          glyph->contours[i][j].x = prev_x + x_delta;
        }
        prev_x = glyph->contours[i][j].x;
      }
    }

    // Read the y coordinates.
    int prev_y = 0;
    for (int i = 0; i < num_contours; ++i) {
      for (size_t j = 0; j < glyph->contours[i].size(); ++j) {
        uint8_t flag = flags[i][j];
        if (flag & kFLAG_YSHORT) {
          // single byte y-delta coord value
          uint8_t y_delta;
          if (!buffer.ReadU8(&y_delta)) {
            return FONT_COMPRESSION_FAILURE();
          }
          int sign = (flag & kFLAG_YREPEATSIGN) ? 1 : -1;
          glyph->contours[i][j].y = prev_y + sign * y_delta;
        } else {
          // double byte y-delta coord value
          int16_t y_delta = 0;
          if (!(flag & kFLAG_YREPEATSIGN)) {
            if (!buffer.ReadS16(&y_delta)) {
              return FONT_COMPRESSION_FAILURE();
            }
          }
          glyph->contours[i][j].y = prev_y + y_delta;
        }
        prev_y = glyph->contours[i][j].y;
      }
    }
  } else if (num_contours == -1) {
    // Composite glyph.
    if (!ReadCompositeGlyphData(&buffer, glyph)) {
      return FONT_COMPRESSION_FAILURE();
    }
    // Read the instructions.
    if (glyph->have_instructions) {
      if (!buffer.ReadU16(&glyph->instructions_size)) {
        return FONT_COMPRESSION_FAILURE();
      }
      glyph->instructions_data = data + buffer.offset();
      if (!buffer.Skip(glyph->instructions_size)) {
        return FONT_COMPRESSION_FAILURE();
      }
    } else {
      glyph->instructions_size = 0;
    }
  } else {
    return FONT_COMPRESSION_FAILURE();
  }
  return true;
}